

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cache.cpp
# Opt level: O2

void __thiscall Cache::PLRUUpdate(Cache *this,uint32_t block_id)

{
  int **ppiVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  
  uVar7 = (this->policy).associativity;
  uVar2 = (ulong)uVar7;
  uVar5 = (ulong)block_id % uVar2;
  ppiVar1 = this->plru_bit;
  for (uVar6 = 1; uVar6 < uVar7; uVar6 = iVar4 + uVar6 * 2) {
    uVar3 = (long)(int)uVar5 / 2;
    iVar4 = (int)uVar5 + (int)uVar3 * -2;
    uVar5 = uVar3 & 0xffffffff;
    ppiVar1[block_id / uVar2][(int)uVar6] = (uint)(iVar4 == 0);
    uVar7 = (this->policy).associativity;
  }
  return;
}

Assistant:

void Cache::PLRUUpdate(uint32_t block_id) {
    uint32_t set_id = block_id / this->policy.associativity;
    uint32_t id2 = block_id % this->policy.associativity;
    int node, tmp;
    for (node = 1, tmp = id2; node < this->policy.associativity;) {
        plru_bit[set_id][node] = tmp % 2 == 0 ? 1 : 0;
        node = node * 2 + tmp % 2;
        tmp /= 2;
    }
}